

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O3

int __thiscall
bv::internal::bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
copy(bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this,
    EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  _Map_pointer ppuVar1;
  sbyte sVar2;
  int extraout_EAX;
  word_type wVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  word_type wVar7;
  EVP_PKEY_CTX *in_RCX;
  EVP_PKEY_CTX *end;
  ulong uVar8;
  long lVar9;
  _Elt_pointer puVar10;
  ulong uVar11;
  _Elt_pointer puVar12;
  ulong uVar13;
  word_type *pwVar14;
  byte bVar15;
  EVP_PKEY_CTX *in_R8;
  ulong uVar16;
  long in_R9;
  ulong uVar17;
  EVP_PKEY_CTX *pEVar18;
  EVP_PKEY_CTX *begin;
  ulong uVar19;
  long lVar20;
  
  uVar17 = in_R9 - (long)in_R8;
  end = src + uVar17;
  if ((ulong)((long)in_RCX - (long)src) <= uVar17) {
    end = in_RCX;
    uVar17 = (long)in_RCX - (long)src;
  }
  pEVar18 = in_R8 + uVar17;
  if (src < in_R8 && (EVP_PKEY_CTX *)this == dst) {
    copy_backward<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
              (this,(bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                     *)dst,(size_t)src,(size_t)end,(size_t)in_R8,(size_t)pEVar18);
    return extraout_EAX;
  }
  uVar19 = (ulong)in_R8 >> 6;
  uVar11 = (ulong)pEVar18 >> 6;
  uVar5 = (ulong)((uint)in_R8 & 0x3f);
  uVar17 = 0;
  if (uVar19 == uVar11) {
    uVar17 = (ulong)pEVar18 | 0xffffffffffffffc0;
  }
  pEVar18 = src + uVar17 + (0x40 - uVar5);
  wVar3 = get((bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *)
              dst,(size_t)src,(size_t)pEVar18);
  puVar10 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  ppuVar1 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node;
  uVar4 = ((long)puVar10 -
           (long)(this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar19;
  uVar8 = (long)uVar4 >> 6;
  uVar13 = uVar8;
  if ((long)uVar4 < 0) {
LAB_00114300:
    puVar12 = ppuVar1[uVar13] + uVar4 + uVar13 * -0x40;
  }
  else {
    if (0x3f < uVar4) {
      uVar13 = uVar4 >> 6;
      goto LAB_00114300;
    }
    puVar12 = puVar10 + uVar19;
  }
  bVar15 = 0x40 - (-(char)in_R8 & 0x3fU);
  sVar2 = (bVar15 < 0x41) * ('@' - bVar15);
  uVar13 = (*puVar12 << sVar2) >> sVar2;
  if (uVar5 == 0) {
    uVar13 = 0;
  }
  uVar13 = uVar13 | wVar3 << uVar5;
  uVar5 = uVar8;
  if ((long)uVar4 < 0) {
LAB_00114376:
    uVar16 = 0;
    if (uVar19 == uVar11) {
      uVar16 = (ppuVar1[uVar5][uVar4 + uVar5 * -0x40] >> (uVar17 & 0x3f)) << (uVar17 & 0x3f);
    }
    uVar13 = uVar13 | uVar16;
    if (-1 < (long)uVar4) {
      if (uVar4 < 0x40) goto LAB_001143ae;
      uVar8 = uVar4 >> 6;
    }
    puVar6 = ppuVar1[uVar8] + uVar4 + uVar8 * -0x40;
  }
  else {
    if (0x3f < uVar4) {
      uVar5 = uVar4 >> 6;
      goto LAB_00114376;
    }
    uVar5 = 0;
    if (uVar19 == uVar11) {
      uVar5 = (puVar10[uVar19] >> (uVar17 & 0x3f)) << (uVar17 & 0x3f);
    }
    uVar13 = uVar13 | uVar5;
LAB_001143ae:
    puVar6 = puVar10 + uVar19;
  }
  uVar17 = uVar19 + 1;
  *puVar6 = uVar13;
  if (uVar17 < uVar11) {
    lVar20 = uVar19 * 8;
    begin = pEVar18;
    do {
      lVar20 = lVar20 + 8;
      pEVar18 = begin + 0x40;
      puVar6 = (ulong *)get((bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                             *)dst,(size_t)begin,(size_t)pEVar18);
      puVar10 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      lVar9 = (long)puVar10 -
              (long)(this->_container).
                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first >> 3;
      uVar19 = uVar17 + lVar9;
      if ((long)uVar19 < 0) {
        uVar19 = (long)uVar19 >> 6;
LAB_0011442f:
        pwVar14 = (this->_container).
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar19] + lVar9 + uVar19 * -0x40 + uVar17;
      }
      else {
        if (0x3f < uVar19) {
          uVar19 = uVar19 >> 6;
          goto LAB_0011442f;
        }
        pwVar14 = (word_type *)((long)puVar10 + lVar20);
      }
      uVar17 = uVar17 + 1;
      *pwVar14 = (word_type)puVar6;
      begin = pEVar18;
    } while (uVar11 != uVar17);
  }
  lVar20 = (long)pEVar18 - (long)end;
  if (lVar20 == 0) {
    return (int)puVar6;
  }
  wVar7 = get((bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *)
              dst,(size_t)pEVar18,(size_t)end);
  puVar10 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  ppuVar1 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node;
  uVar19 = ((long)puVar10 -
            (long)(this->_container).
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first >> 3) + uVar11;
  wVar3 = (long)uVar19 >> 6;
  uVar17 = wVar3;
  if ((long)uVar19 < 0) {
LAB_001144a3:
    puVar6 = ppuVar1[uVar17] + uVar19 + uVar17 * -0x40;
  }
  else {
    if (0x3f < uVar19) {
      uVar17 = uVar19 >> 6;
      goto LAB_001144a3;
    }
    puVar6 = puVar10 + uVar11;
  }
  uVar17 = 0;
  if (lVar20 != -0x40) {
    uVar17 = (*puVar6 >> ((ulong)(byte)-(char)lVar20 & 0x3f)) << ((ulong)(byte)-(char)lVar20 & 0x3f)
    ;
  }
  if (-1 < (long)uVar19) {
    if (uVar19 < 0x40) {
      puVar10 = puVar10 + uVar11;
      wVar3 = wVar7;
      goto LAB_00114508;
    }
    wVar3 = uVar19 >> 6;
  }
  puVar10 = ppuVar1[wVar3] + uVar19 + wVar3 * -0x40;
LAB_00114508:
  *puVar10 = uVar17 | wVar7;
  return (int)wVar3;
}

Assistant:

void bitview<Container>::copy(bitview const&src,
                                      size_t src_begin, size_t src_end,
                                      size_t dest_begin, size_t dest_end)
        {
            size_t srclen = src_end - src_begin;
            size_t destlen = dest_end - dest_begin;
            
            if(destlen < srclen) {
                src_end = src_begin + destlen;
                srclen  = destlen;
            }
            
            if(this == &src && src_begin < dest_begin)
                copy_backward(src, src_begin, src_end, 
                              dest_begin, dest_begin + srclen);
            else
                copy_forward(src, src_begin, src_end, 
                             dest_begin, dest_begin + srclen);
        }